

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkPartitionSmart(Abc_Ntk_t *pNtk,int nSuppSizeLimit,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *vOne;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  uint *puVar8;
  void *pvVar9;
  Vec_Ptr_t *vPartSuppsAll;
  ProgressBar *p;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  void **ppvVar13;
  long lVar14;
  long lVar15;
  Abc_Ntk_t *pAVar16;
  uint uVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  timespec ts;
  long local_88;
  Vec_Ptr_t local_80;
  uint *local_70;
  Abc_Ntk_t *local_68;
  void **local_60;
  int local_58;
  int local_54;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  long local_40;
  ProgressBar *local_38;
  
  local_68 = pNtk;
  local_54 = nSuppSizeLimit;
  iVar3 = clock_gettime(3,(timespec *)&local_80);
  if (iVar3 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80.pArray),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  pAVar16 = local_68;
  pVVar5 = Abc_NtkComputeSupportsSmart(local_68);
  if (fVerbose != 0) {
    Abc_Print((int)pAVar16,"%s =","Supps");
    iVar18 = 3;
    iVar3 = clock_gettime(3,(timespec *)&local_80);
    if (iVar3 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = (long)local_80.pArray / 1000 + local_80._0_8_ * 1000000;
    }
    Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar15 + lVar14) / 1000000.0);
  }
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  iVar3 = clock_gettime(3,(timespec *)&local_80);
  if (iVar3 < 0) {
    local_40 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80.pArray),8);
    local_40 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  local_58 = fVerbose;
  puVar8 = (uint *)malloc(0x10);
  puVar8[0] = 0x100;
  puVar8[1] = 0;
  pvVar9 = malloc(0x800);
  *(void **)(puVar8 + 2) = pvVar9;
  local_70 = puVar8;
  vPartSuppsAll = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsAll->nCap = 0x100;
  vPartSuppsAll->nSize = 0;
  ppvVar7 = (void **)malloc(0x800);
  vPartSuppsAll->pArray = ppvVar7;
  uVar4 = pVVar5->nSize;
  pAVar16 = (Abc_Ntk_t *)(ulong)uVar4;
  p = Extra_ProgressBarStart(_stdout,uVar4);
  local_50 = pVVar5;
  local_48 = vPartSuppsAll;
  if (0 < (int)uVar4) {
    ppvVar7 = (void **)0x0;
    local_38 = p;
    do {
      vOne = (Vec_Int_t *)local_50->pArray[(long)ppvVar7];
      if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= (long)ppvVar7)) {
        Extra_ProgressBarUpdate_int(p,(int)ppvVar7,(char *)0x0);
      }
      local_60 = ppvVar7;
      if (vOne->nSize < 1) goto LAB_002e9cf6;
      uVar4 = vOne->nSize - 1;
      vOne->nSize = uVar4;
      iVar3 = vOne->pArray[uVar4];
      pVVar5 = &local_80;
      clock_gettime(3,(timespec *)&local_80);
      uVar4 = Abc_NtkPartitionSmartFindPart(vPartSuppsAll,pVVar5,pVVar6,local_54,vOne);
      clock_gettime(3,(timespec *)&local_80);
      if (uVar4 == 0xffffffff) {
        pVVar11 = (Vec_Int_t *)malloc(0x10);
        pVVar11->nCap = 0x20;
        pVVar11->nSize = 0;
        piVar12 = (int *)malloc(0x80);
        pVVar11->pArray = piVar12;
        Vec_IntPush(pVVar11,iVar3);
        piVar12 = (int *)malloc(0x10);
        iVar3 = vOne->nSize;
        lVar14 = (long)iVar3;
        piVar12[1] = iVar3;
        *piVar12 = iVar3;
        if (lVar14 == 0) {
          pvVar9 = (void *)0x0;
        }
        else {
          pvVar9 = malloc(lVar14 * 4);
        }
        *(void **)(piVar12 + 2) = pvVar9;
        memcpy(pvVar9,vOne->pArray,lVar14 << 2);
        uVar4 = local_70[1];
        uVar1 = *local_70;
        if (uVar4 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(local_70 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(local_70 + 2),0x80);
            }
            uVar17 = 0x10;
          }
          else {
            uVar17 = uVar1 * 2;
            if ((int)uVar17 <= (int)uVar1) goto LAB_002e9758;
            if (*(void **)(local_70 + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(local_70 + 2),(ulong)uVar1 << 4);
            }
          }
          *(void **)(local_70 + 2) = pvVar9;
          *local_70 = uVar17;
        }
LAB_002e9758:
        p = local_38;
        local_70[1] = uVar4 + 1;
        *(Vec_Int_t **)(*(long *)(local_70 + 2) + (long)(int)uVar4 * 8) = pVVar11;
        uVar4 = vPartSuppsAll->nSize;
        uVar1 = vPartSuppsAll->nCap;
        if (uVar4 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vPartSuppsAll->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar1 * 2;
            if (iVar3 <= (int)uVar1) goto LAB_002e97d3;
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vPartSuppsAll->pArray,(ulong)uVar1 << 4);
            }
          }
          vPartSuppsAll->pArray = ppvVar7;
          vPartSuppsAll->nCap = iVar3;
        }
LAB_002e97d3:
        vPartSuppsAll->nSize = uVar4 + 1;
        vPartSuppsAll->pArray[(int)uVar4] = piVar12;
        puVar8 = Abc_NtkSuppCharStart(vOne,local_68->vCis->nSize);
        ppvVar7 = local_60;
        uVar4 = pVVar6->nSize;
        uVar1 = pVVar6->nCap;
        if (uVar4 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc(0x80);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar1 * 2;
            if (iVar3 <= (int)uVar1) goto LAB_002e986f;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
            }
          }
          pVVar6->pArray = ppvVar13;
          pVVar6->nCap = iVar3;
        }
LAB_002e986f:
        pVVar6->nSize = uVar4 + 1;
        pVVar6->pArray[(int)uVar4] = puVar8;
      }
      else {
        if (((int)uVar4 < 0) || ((int)local_70[1] <= (int)uVar4)) goto LAB_002e9cd7;
        uVar20 = (ulong)uVar4;
        Vec_IntPush(*(Vec_Int_t **)(*(long *)(local_70 + 2) + uVar20 * 8),iVar3);
        if (vPartSuppsAll->nSize <= (int)uVar4) goto LAB_002e9cd7;
        ppvVar7 = vPartSuppsAll->pArray;
        pVVar11 = (Vec_Int_t *)ppvVar7[uVar20];
        pVVar10 = Vec_IntTwoMerge(pVVar11,vOne);
        if (pVVar11->pArray != (int *)0x0) {
          free(pVVar11->pArray);
          pVVar11->pArray = (int *)0x0;
        }
        if (pVVar11 != (Vec_Int_t *)0x0) {
          free(pVVar11);
        }
        ppvVar7[uVar20] = pVVar10;
        if (pVVar6->nSize <= (int)uVar4) goto LAB_002e9cd7;
        Abc_NtkSuppCharAdd((uint *)pVVar6->pArray[uVar20],vOne,local_68->vCis->nSize);
        p = local_38;
        ppvVar7 = local_60;
        vPartSuppsAll = local_48;
      }
      ppvVar7 = (void **)((long)ppvVar7 + 1);
      pAVar16 = (Abc_Ntk_t *)(long)local_50->nSize;
    } while ((long)ppvVar7 < (long)pAVar16);
  }
  local_68 = pAVar16;
  Extra_ProgressBarStop(p);
  iVar3 = pVVar6->nSize;
  if (0 < (long)iVar3) {
    ppvVar7 = pVVar6->pArray;
    lVar14 = 0;
    do {
      if (ppvVar7[lVar14] != (void *)0x0) {
        free(ppvVar7[lVar14]);
      }
      lVar14 = lVar14 + 1;
    } while (iVar3 != lVar14);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  free(pVVar6);
  if (local_58 != 0) {
    Abc_Print((int)pVVar6,"%s =","Parts");
    iVar18 = 3;
    iVar3 = clock_gettime(3,(timespec *)&local_80);
    if (iVar3 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = (long)local_80.pArray / 1000 + local_80._0_8_ * 1000000;
    }
    Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar14 + local_40) / 1000000.0);
  }
  iVar3 = clock_gettime(3,(timespec *)&local_80);
  if (iVar3 < 0) {
    local_88 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_80.pArray),8);
    local_88 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_80._0_8_ * -1000000;
  }
  iVar3 = vPartSuppsAll->nSize;
  sVar19 = (size_t)iVar3;
  if (0 < (long)sVar19) {
    ppvVar7 = vPartSuppsAll->pArray;
    sVar21 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)ppvVar7[sVar21],(int)sVar21);
      sVar21 = sVar21 + 1;
    } while (sVar19 != sVar21);
  }
  local_60 = vPartSuppsAll->pArray;
  qsort(local_60,sVar19,8,Vec_VecSortCompare2);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  ppvVar7 = (void **)malloc(0x800);
  pVVar5->pArray = ppvVar7;
  puVar8 = local_70;
  if (0 < iVar3) {
    sVar21 = 0;
    do {
      pvVar9 = local_60[sVar21];
      if (*(int *)((long)pvVar9 + 4) < 1) {
LAB_002e9cf6:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar4 = *(int *)((long)pvVar9 + 4) - 1;
      *(uint *)((long)pvVar9 + 4) = uVar4;
      iVar3 = *(int *)(*(long *)((long)pvVar9 + 8) + (ulong)uVar4 * 4);
      if (((long)iVar3 < 0) || ((int)puVar8[1] <= iVar3)) {
LAB_002e9cd7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar9 = *(void **)(*(long *)(puVar8 + 2) + (long)iVar3 * 8);
      uVar4 = pVVar5->nSize;
      uVar1 = pVVar5->nCap;
      if (uVar4 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar1 * 2;
          if (iVar3 <= (int)uVar1) goto LAB_002e9af7;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar5->pArray = ppvVar7;
        pVVar5->nCap = iVar3;
        puVar8 = local_70;
      }
LAB_002e9af7:
      pVVar5->nSize = uVar4 + 1;
      pVVar5->pArray[(int)uVar4] = pvVar9;
      sVar21 = sVar21 + 1;
      vPartSuppsAll = local_48;
    } while (sVar19 != sVar21);
  }
  iVar3 = local_58;
  if (*(void **)(puVar8 + 2) != (void *)0x0) {
    free(*(void **)(puVar8 + 2));
    local_70[2] = 0;
    local_70[3] = 0;
    puVar8 = local_70;
  }
  free(puVar8);
  pVVar6 = pVVar5;
  Abc_NtkPartitionCompact(pVVar5,vPartSuppsAll,local_54);
  if (iVar3 != 0) {
    Abc_Print((int)pVVar6,"%s =","Comps");
    iVar18 = 3;
    iVar3 = clock_gettime(3,(timespec *)&local_80);
    if (iVar3 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = (long)local_80.pArray / 1000 + local_80._0_8_ * 1000000;
    }
    Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar14 + local_88) / 1000000.0);
    printf("Created %d partitions.\n",(ulong)(uint)pVVar5->nSize);
  }
  local_48 = (Vec_Ptr_t *)sVar19;
  if (0 < (int)local_68) {
    ppvVar7 = local_50->pArray;
    uVar22 = (ulong)local_68 & 0xffffffff;
    uVar20 = 0;
    do {
      pvVar9 = ppvVar7[uVar20];
      if (pvVar9 != (void *)0x0) {
        if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar9 + 8));
          *(undefined8 *)((long)pvVar9 + 8) = 0;
        }
        free(pvVar9);
      }
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  pVVar6 = local_50;
  if (local_50->pArray != (void **)0x0) {
    free(local_50->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  pVVar2 = local_48;
  ppvVar7 = local_60;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  if (0 < (int)pVVar2) {
    sVar19 = 0;
    do {
      pvVar9 = ppvVar7[sVar19];
      if (pvVar9 != (void *)0x0) {
        if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar9 + 8));
          *(undefined8 *)((long)pvVar9 + 8) = 0;
        }
        free(pvVar9);
      }
      sVar19 = sVar19 + 1;
    } while (pVVar2 != (Vec_Ptr_t *)sVar19);
  }
  if (ppvVar7 != (void **)0x0) {
    free(ppvVar7);
    vPartSuppsAll->pArray = (void **)0x0;
  }
  free(vPartSuppsAll);
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nSuppSizeLimit, int fVerbose )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vPartSuppsChar;
    Vec_Ptr_t * vSupps, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut, timeFind = 0;
    abctime clk, clk2;

    // compute the supports for all outputs
clk = Abc_Clock();
//    vSupps = Abc_NtkComputeSupportsNaive( pNtk );
    vSupps = Abc_NtkComputeSupportsSmart( pNtk );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsChar = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
//        if ( i % 1000 == 0 )
//            printf( "CIs = %6d. COs = %6d. Processed = %6d (out of %6d). Parts = %6d.\r", 
//                Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), i, Vec_PtrSize(vSupps), Vec_PtrSize(vPartsAll) ); 
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
clk2 = Abc_Clock();
        iPart = Abc_NtkPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsChar, nSuppSizeLimit, vOne );
timeFind += Abc_Clock() - clk2;
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsChar, Abc_NtkSuppCharStart(vOne, Abc_NtkCiNum(pNtk)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Abc_NtkSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsChar, iPart), vOne, Abc_NtkCiNum(pNtk) );
        }
    }
    Extra_ProgressBarStop( pProgress );

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsChar, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsChar );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
//ABC_PRT( "Find ", timeFind );
}

clk = Abc_Clock();
    // remember number of supports
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );
    Abc_NtkPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );

if ( fVerbose )
{
ABC_PRT( "Comps", Abc_Clock() - clk );
}
    if ( fVerbose )
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Abc_NtkCo(pNtk, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}